

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_primitives_generated_query_features
          (Impl *this,Value *state,
          VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT **out_features)

{
  uint uVar1;
  VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *pVVar2;
  Type pGVar3;
  VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *features;
  VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT **out_features_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT>
                     (&this->allocator);
  *out_features = pVVar2;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"primitivesGeneratedQuery");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->primitivesGeneratedQuery = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"primitivesGeneratedQueryWithNonZeroStreams");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->primitivesGeneratedQueryWithNonZeroStreams = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"primitivesGeneratedQueryWithRasterizerDiscard");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->primitivesGeneratedQueryWithRasterizerDiscard = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_primitives_generated_query_features(
		const Value &state,
		VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT>();
	*out_features = features;

	features->primitivesGeneratedQuery = state["primitivesGeneratedQuery"].GetUint();
	features->primitivesGeneratedQueryWithNonZeroStreams = state["primitivesGeneratedQueryWithNonZeroStreams"].GetUint();
	features->primitivesGeneratedQueryWithRasterizerDiscard = state["primitivesGeneratedQueryWithRasterizerDiscard"].GetUint();
	return true;
}